

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O2

void sylvan_init_mt(void)

{
  if (mt_initialized == '\0') {
    mt_initialized = '\x01';
    sylvan_register_quit(sylvan_mt_quit);
    llmsset_set_custom((llmsset_t_conflict)nodes,_sylvan_hash_cb,_sylvan_equals_cb,_sylvan_create_cb
                       ,_sylvan_destroy_cb);
    cl_registry_size = 8;
    cl_registry = (customleaf_t *)calloc(0x38,8);
    cl_registry_count = 3;
  }
  return;
}

Assistant:

void
sylvan_init_mt()
{
    if (mt_initialized) return;
    mt_initialized = 1;

    // Register quit handler to free structures
    sylvan_register_quit(sylvan_mt_quit);

    // Tell llmsset to use our custom hooks
    llmsset_set_custom(nodes, _sylvan_hash_cb, _sylvan_equals_cb, _sylvan_create_cb, _sylvan_destroy_cb);

    // Initialize data structures
    cl_registry_size = 8;
    cl_registry = (customleaf_t *)calloc(sizeof(customleaf_t), cl_registry_size);
    cl_registry_count = 3; // 0, 1, 2 are taken
}